

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktOpaqueTypeIndexingTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::shaderexecutor::anon_unknown_0::BlockArrayIndexingCaseInstance::iterate
          (TestStatus *__return_storage_ptr__,BlockArrayIndexingCaseInstance *this)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  pointer puVar4;
  long *plVar5;
  undefined8 *puVar6;
  pointer piVar7;
  BlockArrayIndexingCaseInstance *pBVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  TestStatus *pTVar11;
  undefined8 uVar12;
  VkDevice device;
  undefined1 auVar13 [8];
  pointer __s;
  Buffer *pBVar14;
  long *plVar15;
  int *piVar16;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar17;
  pointer piVar18;
  ShaderExecutor *pSVar19;
  pointer puVar20;
  VkDeviceSize *pVVar21;
  int readNdx;
  long lVar22;
  ulong __n;
  VkDescriptorType VVar23;
  long lVar24;
  uint *puVar25;
  ulong uVar26;
  pointer pSVar27;
  BlockArrayIndexingCaseInstance *pBVar28;
  bool bVar29;
  vector<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_> bufferInfos;
  VkDescriptorSetLayoutCreateInfo layoutInfo;
  MovePtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer,_de::DefaultDeleter<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>
  indexBuffer;
  VkDescriptorPoolSize poolSizes [2];
  vector<void_*,_std::allocator<void_*>_> inputs;
  vector<int,_std::allocator<int>_> expandedIndices;
  vector<void_*,_std::allocator<void_*>_> outputs;
  VkDescriptorSetLayoutBinding bindings [2];
  undefined1 local_358 [24];
  undefined8 uStack_340;
  BlockArrayIndexingCaseInstance *local_330;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_328;
  undefined8 local_320;
  Buffer *local_318;
  uint *local_310;
  undefined1 local_308 [8];
  undefined1 auStack_300 [8];
  undefined1 local_2f8 [24];
  TestStatus *local_2e0;
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  UniqueBase<vkt::shaderexecutor::(anonymous_namespace)::Buffer,_de::DefaultDeleter<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>
  local_2b8;
  undefined1 local_2a8 [8];
  undefined1 auStack_2a0 [8];
  undefined1 local_298 [16];
  undefined1 local_288 [8];
  undefined1 auStack_280 [8];
  undefined1 local_278 [16];
  undefined1 local_268 [8];
  undefined1 auStack_260 [8];
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  long local_238;
  undefined1 local_228 [16];
  pointer local_218;
  VkDevice local_208;
  string *local_200;
  undefined1 local_1f8 [16];
  long local_1e8;
  vector<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>,_std::allocator<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>_>
  local_1d8;
  Buffer *local_1c0;
  undefined1 local_1b8 [8];
  undefined8 local_1b0;
  Buffer local_1a8;
  ios_base local_140 [272];
  
  local_310 = (uint *)operator_new(0x200);
  memset(local_310,0,0x200);
  local_1c0 = (Buffer *)
              ((this->super_OpaqueTypeIndexingTestInstance).super_TestInstance.m_context)->m_testCtx
              ->m_log;
  local_1b8 = (undefined1  [8])&local_1a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"Pass","");
  __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
  local_200 = (string *)&__return_storage_ptr__->m_description;
  local_328 = &(__return_storage_ptr__->m_description).field_2;
  (__return_storage_ptr__->m_description)._M_dataplus._M_p = (pointer)local_328;
  std::__cxx11::string::_M_construct<char*>(local_200,local_1b8,(long)local_1b0 + (long)local_1b8);
  local_2e0 = __return_storage_ptr__;
  if (local_1b8 != (undefined1  [8])&local_1a8) {
    operator_delete((void *)local_1b8,(ulong)((long)local_1a8.m_vkd + 1));
  }
  local_218 = (pointer)0x0;
  local_228 = (undefined1  [16])0x0;
  local_238 = 0;
  local_248 = (undefined1  [16])0x0;
  local_1e8 = 0;
  local_1f8 = (undefined1  [16])0x0;
  bVar29 = *(int *)&(this->super_OpaqueTypeIndexingTestInstance).field_0x34 == 0;
  local_318 = (Buffer *)
              Context::getDeviceInterface
                        ((this->super_OpaqueTypeIndexingTestInstance).super_TestInstance.m_context);
  local_208 = Context::getDevice((this->super_OpaqueTypeIndexingTestInstance).super_TestInstance.
                                 m_context);
  puVar20 = (this->m_inValues->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
            _M_impl.super__Vector_impl_data._M_start;
  puVar4 = (this->m_inValues->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  lVar22 = (long)puVar4 - (long)puVar20;
  uVar26 = lVar22 >> 2;
  local_330 = this;
  if (uVar26 >> 0x3b == 0) {
    local_1d8.
    super__Vector_base<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>,_std::allocator<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    if (puVar4 == puVar20) {
      local_1d8.
      super__Vector_base<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>,_std::allocator<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      __s = (pointer)0x0;
      pSVar27 = (pointer)0x0;
      local_1d8.
      super__Vector_base<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>,_std::allocator<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    }
    else {
      __n = lVar22 * 4;
      __s = (pointer)operator_new(__n);
      pSVar27 = __s + uVar26;
      local_1d8.
      super__Vector_base<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>,_std::allocator<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>_>
      ._M_impl.super__Vector_impl_data._M_start = __s;
      memset(__s,0,__n);
      local_1d8.
      super__Vector_base<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>,_std::allocator<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)((long)__s + __n);
    }
    pBVar28 = local_330;
    VVar23 = (VkDescriptorType)bVar29;
    local_2b8.m_data.ptr = (Buffer *)0x0;
    local_298 = (undefined1  [16])0x0;
    _local_2a8 = (undefined1  [16])0x0;
    local_258 = (undefined1  [16])0x0;
    _local_268 = (undefined1  [16])0x0;
    local_2c8 = (undefined1  [16])0x0;
    local_2d8 = (undefined1  [16])0x0;
    local_320 = (uint *)(CONCAT44(local_320._4_4_,VVar23) ^ 7);
    local_1d8.
    super__Vector_base<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>,_std::allocator<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = pSVar27;
    OpaqueTypeIndexingTestInstance::checkSupported
              (&local_330->super_OpaqueTypeIndexingTestInstance,
               VVar23 ^ VK_DESCRIPTOR_TYPE_STORAGE_BUFFER);
    pvVar17 = pBVar28->m_inValues;
    puVar20 = (pvVar17->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    if (puVar20 !=
        (pvVar17->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_start) {
      lVar22 = 0;
      uVar26 = 0;
      do {
        pBVar14 = (Buffer *)operator_new(0x40);
        anon_unknown_0::Buffer::Buffer
                  (pBVar14,(local_330->super_OpaqueTypeIndexingTestInstance).super_TestInstance.
                           m_context,(uint)!bVar29 * 0x10 + 0x10,4);
        plVar15 = (long *)operator_new(0x20);
        *(undefined4 *)(plVar15 + 1) = 0;
        *(undefined4 *)((long)plVar15 + 0xc) = 0;
        *plVar15 = (long)&PTR__SharedPtrState_00d19ae8;
        plVar15[2] = (long)pBVar14;
        *(undefined4 *)(plVar15 + 1) = 1;
        *(undefined4 *)((long)plVar15 + 0xc) = 1;
        plVar5 = *(long **)((long)&__s->m_state + lVar22);
        if (plVar5 != plVar15) {
          if (plVar5 != (long *)0x0) {
            LOCK();
            plVar5 = plVar5 + 1;
            *(int *)plVar5 = (int)*plVar5 + -1;
            UNLOCK();
            if ((int)*plVar5 == 0) {
              *(undefined8 *)((long)&__s->m_ptr + lVar22) = 0;
              (**(code **)(**(long **)((long)&__s->m_state + lVar22) + 0x10))();
            }
            LOCK();
            piVar16 = (int *)(*(long *)((long)&__s->m_state + lVar22) + 0xc);
            *piVar16 = *piVar16 + -1;
            UNLOCK();
            if (*piVar16 == 0) {
              plVar5 = *(long **)((long)&__s->m_state + lVar22);
              if (plVar5 != (long *)0x0) {
                (**(code **)(*plVar5 + 8))();
              }
              *(undefined8 *)((long)&__s->m_state + lVar22) = 0;
            }
          }
          *(Buffer **)((long)&__s->m_ptr + lVar22) = pBVar14;
          *(long **)((long)&__s->m_state + lVar22) = plVar15;
          LOCK();
          *(int *)(plVar15 + 1) = (int)plVar15[1] + 1;
          UNLOCK();
          LOCK();
          piVar16 = (int *)(*(long *)((long)&__s->m_state + lVar22) + 0xc);
          *piVar16 = *piVar16 + 1;
          UNLOCK();
        }
        plVar5 = plVar15 + 1;
        LOCK();
        *(int *)plVar5 = (int)*plVar5 + -1;
        UNLOCK();
        if ((int)*plVar5 == 0) {
          (**(code **)(*plVar15 + 0x10))(plVar15);
        }
        piVar16 = (int *)((long)plVar15 + 0xc);
        LOCK();
        *piVar16 = *piVar16 + -1;
        UNLOCK();
        if (*piVar16 == 0) {
          (**(code **)(*plVar15 + 8))(plVar15);
        }
        __s = local_1d8.
              super__Vector_base<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>,_std::allocator<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
        pBVar28 = local_330;
        puVar6 = *(undefined8 **)
                  ((long)&(local_1d8.
                           super__Vector_base<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>,_std::allocator<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar22);
        lVar24 = puVar6[6];
        **(uint **)(lVar24 + 0x18) =
             (local_330->m_inValues->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
             )._M_impl.super__Vector_impl_data._M_start[uVar26];
        ::vk::flushMappedMemoryRange
                  ((DeviceInterface *)*puVar6,(VkDevice)puVar6[1],
                   (VkDeviceMemory)*(deUint64 *)(lVar24 + 8),*(VkDeviceSize *)(lVar24 + 0x10),
                   0xffffffffffffffff);
        uVar26 = uVar26 + 1;
        pvVar17 = pBVar28->m_inValues;
        puVar20 = (pvVar17->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                  .super__Vector_impl_data._M_start;
        lVar22 = lVar22 + 0x10;
      } while (uVar26 < (ulong)((long)(pvVar17->
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      )._M_impl.super__Vector_impl_data._M_finish - (long)puVar20 >>
                               2));
    }
    pBVar28 = local_330;
    if ((local_330->super_OpaqueTypeIndexingTestInstance).m_indexExprType == INDEX_EXPR_TYPE_UNIFORM
       ) {
      createUniformIndexBuffer
                ((MovePtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer,_de::DefaultDeleter<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>
                  *)local_1b8,
                 (local_330->super_OpaqueTypeIndexingTestInstance).super_TestInstance.m_context,
                 (int)(local_330->m_readIndices->super__Vector_base<int,_std::allocator<int>_>).
                      _M_impl.super__Vector_impl_data._M_start,(int *)puVar20);
      auVar13 = local_1b8;
      local_1b8 = (undefined1  [8])0x0;
      if ((undefined1  [8])local_2b8.m_data.ptr != auVar13) {
        de::details::
        UniqueBase<vkt::shaderexecutor::(anonymous_namespace)::Buffer,_de::DefaultDeleter<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>
        ::reset(&local_2b8);
        local_2b8.m_data.ptr = (Buffer *)auVar13;
      }
      de::details::
      UniqueBase<vkt::shaderexecutor::(anonymous_namespace)::Buffer,_de::DefaultDeleter<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>
      ::reset((UniqueBase<vkt::shaderexecutor::(anonymous_namespace)::Buffer,_de::DefaultDeleter<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>
               *)local_1b8);
      pvVar17 = pBVar28->m_inValues;
      puVar20 = (pvVar17->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start;
    }
    local_1b8 = (undefined1  [8])((long)local_320 << 0x20);
    local_1a8.m_device._0_4_ =
         (deUint32)
         ((ulong)((long)(pvVar17->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)puVar20) >> 2);
    local_1b0 = (VkDevice *)CONCAT44(0x7fffffff,(deUint32)local_1a8.m_device);
    local_1a8.m_vkd = (DeviceInterface *)0x0;
    local_1a8.m_device._4_4_ = 6;
    local_1a8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal._0_4_
         = 1;
    local_1a8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal._4_4_
         = 0x7fffffff;
    local_1a8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)0x0;
    local_308._0_4_ = 0x20;
    auStack_300 = (undefined1  [8])0x0;
    local_2f8._8_8_ = local_1b8;
    local_2f8._0_8_ = 0x200000000;
    ::vk::createDescriptorSetLayout
              ((Move<vk::Handle<(vk::HandleType)19>_> *)local_288,(DeviceInterface *)local_318,
               local_208,(VkDescriptorSetLayoutCreateInfo *)local_308,(VkAllocationCallbacks *)0x0);
    auVar10 = local_278;
    auVar9 = _local_288;
    local_358._16_8_ = local_278._0_8_;
    uStack_340 = (VkAllocationCallbacks *)local_278._8_8_;
    local_358._0_8_ = local_288;
    local_358._8_8_ = auStack_280;
    _local_288 = (undefined1  [16])0x0;
    local_278 = (undefined1  [16])0x0;
    if (local_2a8 == (undefined1  [8])0x0) {
      local_298 = auVar10;
      _local_2a8 = auVar9;
    }
    else {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)19>_> *)(local_2a8 + 8),
                 (VkDescriptorSetLayout)local_2a8);
      auStack_2a0 = (undefined1  [8])local_358._8_8_;
      local_2a8 = (undefined1  [8])local_358._0_8_;
      local_298._8_8_ = uStack_340;
      local_298._0_8_ = local_358._16_8_;
      if (local_288 != (undefined1  [8])0x0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()
                  ((Deleter<vk::Handle<(vk::HandleType)19>_> *)(local_288 + 8),
                   (VkDescriptorSetLayout)local_288);
      }
    }
    device = local_208;
    pBVar14 = local_318;
    local_288._4_4_ =
         (int)((ulong)((long)(pBVar28->m_inValues->
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)(pBVar28->m_inValues->
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                            .super__Vector_impl_data._M_start) >> 2);
    local_288._0_4_ = (undefined4)local_320;
    auStack_280 = (undefined1  [8])0x100000006;
    local_1b8._0_4_ = 0x21;
    local_1b0 = (VkDevice *)0x0;
    local_1a8.m_vkd = (DeviceInterface *)0x100000001;
    local_1a8.m_device._0_4_ = 2;
    local_1a8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal =
         (deUint64)local_288;
    ::vk::createDescriptorPool
              ((Move<vk::Handle<(vk::HandleType)21>_> *)local_308,(DeviceInterface *)local_318,
               local_208,(VkDescriptorPoolCreateInfo *)local_1b8,(VkAllocationCallbacks *)0x0);
    auVar10 = local_2f8._0_16_;
    auVar9 = _local_308;
    local_358._16_8_ = local_2f8._0_8_;
    uStack_340 = (VkAllocationCallbacks *)local_2f8._8_8_;
    local_358._0_8_ = local_308;
    local_358._8_8_ = auStack_300;
    _local_308 = (undefined1  [16])0x0;
    local_2f8._0_16_ = (undefined1  [16])0x0;
    if (local_268 == (undefined1  [8])0x0) {
      local_258 = auVar10;
      _local_268 = auVar9;
    }
    else {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)21>_> *)(local_268 + 8),
                 (VkDescriptorPool)local_268);
      auStack_260 = (undefined1  [8])local_358._8_8_;
      local_268 = (undefined1  [8])local_358._0_8_;
      local_258._8_8_ = uStack_340;
      local_258._0_8_ = local_358._16_8_;
      if (local_308 != (undefined1  [8])0x0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()
                  ((Deleter<vk::Handle<(vk::HandleType)21>_> *)(local_308 + 8),
                   (VkDescriptorPool)local_308);
      }
    }
    local_1b8._0_4_ = 0x22;
    local_1b0 = (VkDevice *)0x0;
    local_1a8.m_vkd = (DeviceInterface *)local_268;
    local_1a8.m_device._0_4_ = 1;
    local_1a8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal =
         (deUint64)local_2a8;
    ::vk::allocateDescriptorSet
              ((Move<vk::Handle<(vk::HandleType)22>_> *)local_308,(DeviceInterface *)pBVar14,device,
               (VkDescriptorSetAllocateInfo *)local_1b8);
    auVar10 = local_2f8._0_16_;
    auVar9 = _local_308;
    local_358._16_8_ = local_2f8._0_8_;
    uStack_340 = local_2f8._8_8_;
    local_358._0_8_ = local_308;
    local_358._8_8_ = auStack_300;
    _local_308 = (undefined1  [16])0x0;
    local_2f8._0_16_ = (undefined1  [16])0x0;
    if (local_2d8._0_8_ == 0) {
      local_2c8 = auVar10;
      local_2d8 = auVar9;
    }
    else {
      local_288 = (undefined1  [8])local_2d8._0_8_;
      (**(code **)(*(long *)local_2d8._8_8_ + 0x1e8))
                (local_2d8._8_8_,local_2c8._0_8_,local_2c8._8_8_,1);
      local_2d8._8_8_ = local_358._8_8_;
      local_2d8._0_8_ = local_358._0_8_;
      local_2c8._8_4_ = (undefined4)uStack_340;
      local_2c8._0_8_ = local_358._16_8_;
      local_2c8._12_4_ = uStack_340._4_4_;
      if (local_308 != (undefined1  [8])0x0) {
        local_358._0_8_ = local_308;
        (*(*(_func_int ***)auStack_300)[0x3d])(auStack_300,local_2f8._0_8_,local_2f8._8_8_,1);
      }
    }
    std::vector<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>::vector
              ((vector<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_> *)
               local_358,
               (long)(pBVar28->m_inValues->
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(pBVar28->m_inValues->
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                     super__Vector_impl_data._M_start >> 2,(allocator_type *)local_1b8);
    local_1b8._0_4_ = 0x23;
    local_1b0 = (VkDevice *)0x0;
    uVar12 = local_2d8._0_8_;
    local_1a8.m_vkd = (DeviceInterface *)local_2d8._0_8_;
    local_1a8.m_device._0_4_ = 0;
    local_1a8.m_device._4_4_ = 0;
    puVar20 = (pBVar28->m_inValues->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
              ._M_impl.super__Vector_impl_data._M_finish;
    puVar4 = (pBVar28->m_inValues->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
             _M_impl.super__Vector_impl_data._M_start;
    lVar22 = (long)puVar20 - (long)puVar4 >> 2;
    local_1a8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal._0_4_
         = (undefined4)lVar22;
    local_1a8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal._4_4_
         = (undefined4)local_320;
    local_1a8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)0x0;
    local_1a8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
         (VkDevice)local_358._0_8_;
    local_1a8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)0x0;
    if (puVar20 != puVar4) {
      lVar22 = lVar22 + (ulong)(lVar22 == 0);
      pVVar21 = (VkDeviceSize *)(local_358._0_8_ + 0x10);
      do {
        (((VkDescriptorBufferInfo *)(pVVar21 + -2))->buffer).m_internal =
             (__s->m_ptr->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
             m_internal;
        pVVar21[-1] = 0;
        *pVVar21 = 0xffffffffffffffff;
        __s = __s + 1;
        pVVar21 = pVVar21 + 3;
        lVar22 = lVar22 + -1;
      } while (lVar22 != 0);
    }
    (**(_func_int **)(pBVar14->m_vkd + 0x3e))(pBVar14,device,1,local_1b8,0,0);
    if ((pointer)local_358._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_358._0_8_,local_358._16_8_ - local_358._0_8_);
    }
    if (local_2b8.m_data.ptr != (Buffer *)0x0) {
      local_358._0_8_ =
           ((local_2b8.m_data.ptr)->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.
           object.m_internal;
      local_358._8_8_ = (pointer)0x0;
      local_358._16_8_ = (pointer)0xffffffffffffffff;
      local_1b8._0_4_ = 0x23;
      local_1b0 = (VkDevice *)0x0;
      local_1a8.m_vkd = (DeviceInterface *)uVar12;
      local_1a8.m_device._0_4_ =
           (deUint32)
           ((ulong)((long)(pBVar28->m_inValues->
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(pBVar28->m_inValues->
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                         super__Vector_impl_data._M_start) >> 2);
      local_1a8.m_device._4_4_ = 0;
      local_1a8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal.
      _0_4_ = 1;
      local_1a8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal.
      _4_4_ = 6;
      local_1a8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface
           = (DeviceInterface *)0x0;
      local_1a8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
           (VkAllocationCallbacks *)0x0;
      local_1a8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
           (VkDevice)local_358;
      (**(_func_int **)(pBVar14->m_vkd + 0x3e))(pBVar14,device,1,local_1b8,0,0);
    }
    pBVar8 = local_330;
    if ((pBVar28->super_OpaqueTypeIndexingTestInstance).m_indexExprType ==
        INDEX_EXPR_TYPE_DYNAMIC_UNIFORM) {
      std::vector<int,_std::allocator<int>_>::resize
                ((vector<int,_std::allocator<int>_> *)local_228,
                 ((long)(local_330->m_readIndices->super__Vector_base<int,_std::allocator<int>_>).
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)(local_330->m_readIndices->super__Vector_base<int,_std::allocator<int>_>).
                       _M_impl.super__Vector_impl_data._M_start) * 8);
      piVar7 = (pBVar8->m_readIndices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar22 = 0;
      piVar18 = (pointer)local_228._0_8_;
      do {
        iVar1 = piVar7[lVar22];
        lVar24 = 0;
        do {
          piVar16 = piVar18 + lVar24;
          *piVar16 = iVar1;
          piVar16[1] = iVar1;
          piVar16[2] = iVar1;
          piVar16[3] = iVar1;
          lVar24 = lVar24 + 4;
        } while (lVar24 != 0x20);
        lVar22 = lVar22 + 1;
        piVar18 = piVar18 + 0x20;
      } while (lVar22 != 4);
      lVar22 = 0;
      do {
        local_1b8 = (undefined1  [8])(local_228._0_8_ + lVar22);
        std::vector<void*,std::allocator<void*>>::emplace_back<void*>
                  ((vector<void*,std::allocator<void*>> *)local_248,(void **)local_1b8);
        lVar22 = lVar22 + 0x80;
      } while (lVar22 != 0x200);
    }
    lVar22 = 0;
    do {
      local_1b8 = (undefined1  [8])((long)local_310 + lVar22);
      std::vector<void*,std::allocator<void*>>::emplace_back<void*>
                ((vector<void*,std::allocator<void*>> *)local_1f8,(void **)local_1b8);
      pBVar28 = local_330;
      lVar22 = lVar22 + 0x80;
    } while (lVar22 != 0x200);
    pSVar19 = createExecutor((local_330->super_OpaqueTypeIndexingTestInstance).super_TestInstance.
                             m_context,
                             (local_330->super_OpaqueTypeIndexingTestInstance).m_shaderType,
                             (local_330->super_OpaqueTypeIndexingTestInstance).m_shaderSpec,
                             (VkDescriptorSetLayout)local_2a8);
    lVar22 = 0;
    if (local_248._0_8_ != local_248._8_8_) {
      lVar22 = local_248._0_8_;
    }
    local_318 = (Buffer *)uVar12;
    (*pSVar19->_vptr_ShaderExecutor[2])(pSVar19,0x20,lVar22,local_1f8._0_8_,uVar12);
    (*pSVar19->_vptr_ShaderExecutor[1])(pSVar19);
    lVar22 = 0;
    puVar25 = local_310;
    do {
      lVar24 = 0;
      local_320 = puVar25;
      do {
        uVar2 = (pBVar28->m_inValues->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start
                [(pBVar28->m_readIndices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start[lVar24]];
        uVar3 = *puVar25;
        if (uVar2 != uVar3) {
          local_1b8 = (undefined1  [8])local_1c0;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1b0,"ERROR: at invocation ",0x15);
          std::ostream::operator<<((ostringstream *)&local_1b0,(int)lVar22);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,", read ",7);
          std::ostream::operator<<((ostringstream *)&local_1b0,(int)lVar24);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1b0,": expected ",0xb);
          local_358._0_8_ = (pointer)(ulong)uVar2;
          tcu::Format::Hex<8UL>::toStream((Hex<8UL> *)local_358,(ostream *)&local_1b0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,", got ",6);
          local_358._0_8_ = (pointer)(ulong)uVar3;
          tcu::Format::Hex<8UL>::toStream((Hex<8UL> *)local_358,(ostream *)&local_1b0);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b0);
          std::ios_base::~ios_base(local_140);
          if (local_2e0->m_code == QP_TEST_RESULT_PASS) {
            local_358._0_8_ = local_358 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_358,"Invalid result value","");
            local_1b8._0_4_ = 1;
            local_1b0 = &local_1a8.m_device;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_1b0,local_358._0_8_,
                       (undefined1 *)
                       ((long)&((VkBuffer *)local_358._8_8_)->m_internal + local_358._0_8_));
            local_2e0->m_code = local_1b8._0_4_;
            std::__cxx11::string::operator=(local_200,(string *)&local_1b0);
            if (local_1b0 != &local_1a8.m_device) {
              operator_delete(local_1b0,
                              CONCAT44(local_1a8.m_device._4_4_,(deUint32)local_1a8.m_device) + 1);
            }
            if ((pointer)local_358._0_8_ != (pointer)(local_358 + 0x10)) {
              operator_delete((void *)local_358._0_8_,
                              (ulong)((long)&((VkBuffer *)local_358._16_8_)->m_internal + 1));
            }
          }
        }
        pTVar11 = local_2e0;
        lVar24 = lVar24 + 1;
        puVar25 = puVar25 + 0x20;
        pBVar28 = local_330;
      } while (lVar24 != 4);
      lVar22 = lVar22 + 1;
      puVar25 = local_320 + 1;
    } while (lVar22 != 0x20);
    if (local_318 != (Buffer *)0x0) {
      local_1b8 = (undefined1  [8])local_318;
      (**(code **)(*(long *)local_2d8._8_8_ + 0x1e8))
                (local_2d8._8_8_,local_2c8._0_8_,local_2c8._8_8_,1);
    }
    if (local_268 != (undefined1  [8])0x0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)21>_> *)(local_268 + 8),
                 (VkDescriptorPool)local_268);
    }
    if (local_2a8 != (undefined1  [8])0x0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)19>_> *)(local_2a8 + 8),
                 (VkDescriptorSetLayout)local_2a8);
    }
    de::details::
    UniqueBase<vkt::shaderexecutor::(anonymous_namespace)::Buffer,_de::DefaultDeleter<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>
    ::reset(&local_2b8);
    std::
    vector<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>,_std::allocator<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>_>
    ::~vector(&local_1d8);
    if ((void *)local_1f8._0_8_ != (void *)0x0) {
      operator_delete((void *)local_1f8._0_8_,local_1e8 - local_1f8._0_8_);
    }
    if ((void *)local_248._0_8_ != (void *)0x0) {
      operator_delete((void *)local_248._0_8_,local_238 - local_248._0_8_);
    }
    if ((pointer)local_228._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_228._0_8_,(long)local_218 - local_228._0_8_);
    }
    operator_delete(local_310,0x200);
    return pTVar11;
  }
  std::__throw_length_error("cannot create std::vector larger than max_size()");
}

Assistant:

tcu::TestStatus BlockArrayIndexingCaseInstance::iterate (void)
{
	const int					numInvocations		= NUM_INVOCATIONS;
	const int					numReads			= NUM_READS;
	std::vector<deUint32>		outValues			(numInvocations*numReads);

	tcu::TestLog&				log					= m_context.getTestContext().getLog();
	tcu::TestStatus				testResult			= tcu::TestStatus::pass("Pass");

	std::vector<int>			expandedIndices;
	std::vector<void*>			inputs;
	std::vector<void*>			outputs;
	const VkBufferUsageFlags	bufferUsage			= m_blockType == BLOCKTYPE_UNIFORM ? VK_BUFFER_USAGE_UNIFORM_BUFFER_BIT : VK_BUFFER_USAGE_STORAGE_BUFFER_BIT;
	const VkDescriptorType		descriptorType		= m_blockType == BLOCKTYPE_UNIFORM ? VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER : VK_DESCRIPTOR_TYPE_STORAGE_BUFFER;

	const DeviceInterface&		vkd					= m_context.getDeviceInterface();
	const VkDevice				device				= m_context.getDevice();

	// \note Using separate buffer per element - might want to test
	// offsets & single buffer in the future.
	vector<BufferSp>			buffers				(m_inValues.size());
	MovePtr<Buffer>				indexBuffer;

	Move<VkDescriptorSetLayout>	extraResourcesLayout;
	Move<VkDescriptorPool>		extraResourcesSetPool;
	Move<VkDescriptorSet>		extraResourcesSet;

	checkSupported(descriptorType);

	for (size_t bufferNdx = 0; bufferNdx < m_inValues.size(); ++bufferNdx)
	{
		buffers[bufferNdx] = BufferSp(new Buffer(m_context, bufferUsage, sizeof(deUint32)));
		*(deUint32*)buffers[bufferNdx]->getHostPtr() = m_inValues[bufferNdx];
		buffers[bufferNdx]->flush();
	}

	if (m_indexExprType == INDEX_EXPR_TYPE_UNIFORM)
		indexBuffer = createUniformIndexBuffer(m_context, numReads, &m_readIndices[0]);

	{
		const VkDescriptorSetLayoutBinding		bindings[]	=
		{
			{ 0u,							descriptorType,						(deUint32)m_inValues.size(),	VK_SHADER_STAGE_ALL,	DE_NULL		},
			{ (deUint32)m_inValues.size(),	VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,	1u,								VK_SHADER_STAGE_ALL,	DE_NULL		}
		};
		const VkDescriptorSetLayoutCreateInfo	layoutInfo	=
		{
			VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_CREATE_INFO,
			DE_NULL,
			(VkDescriptorSetLayoutCreateFlags)0u,
			DE_LENGTH_OF_ARRAY(bindings),
			bindings,
		};

		extraResourcesLayout = createDescriptorSetLayout(vkd, device, &layoutInfo);
	}

	{
		const VkDescriptorPoolSize			poolSizes[]	=
		{
			{ descriptorType,						(deUint32)m_inValues.size()	},
			{ VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,	1u,							}
		};
		const VkDescriptorPoolCreateInfo	poolInfo	=
		{
			VK_STRUCTURE_TYPE_DESCRIPTOR_POOL_CREATE_INFO,
			DE_NULL,
			(VkDescriptorPoolCreateFlags)VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT,
			1u,		// maxSets
			DE_LENGTH_OF_ARRAY(poolSizes),
			poolSizes,
		};

		extraResourcesSetPool = createDescriptorPool(vkd, device, &poolInfo);
	}

	{
		const VkDescriptorSetAllocateInfo	allocInfo	=
		{
			VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO,
			DE_NULL,
			*extraResourcesSetPool,
			1u,
			&extraResourcesLayout.get(),
		};

		extraResourcesSet = allocateDescriptorSet(vkd, device, &allocInfo);
	}

	{
		vector<VkDescriptorBufferInfo>	bufferInfos			(m_inValues.size());
		const VkWriteDescriptorSet		descriptorWrite		=
		{
			VK_STRUCTURE_TYPE_WRITE_DESCRIPTOR_SET,
			DE_NULL,
			*extraResourcesSet,
			0u,		// dstBinding
			0u,		// dstArrayElement
			(deUint32)m_inValues.size(),
			descriptorType,
			(const VkDescriptorImageInfo*)DE_NULL,
			&bufferInfos[0],
			(const VkBufferView*)DE_NULL,
		};

		for (size_t ndx = 0; ndx < m_inValues.size(); ++ndx)
		{
			bufferInfos[ndx].buffer		= buffers[ndx]->getBuffer();
			bufferInfos[ndx].offset		= 0u;
			bufferInfos[ndx].range		= VK_WHOLE_SIZE;
		}

		vkd.updateDescriptorSets(device, 1u, &descriptorWrite, 0u, DE_NULL);
	}

	if (indexBuffer)
	{
		const VkDescriptorBufferInfo	bufferInfo	=
		{
			indexBuffer->getBuffer(),
			0u,
			VK_WHOLE_SIZE
		};
		const VkWriteDescriptorSet		descriptorWrite		=
		{
			VK_STRUCTURE_TYPE_WRITE_DESCRIPTOR_SET,
			DE_NULL,
			*extraResourcesSet,
			(deUint32)m_inValues.size(),	// dstBinding
			0u,								// dstArrayElement
			1u,
			VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,
			(const VkDescriptorImageInfo*)DE_NULL,
			&bufferInfo,
			(const VkBufferView*)DE_NULL,
		};

		vkd.updateDescriptorSets(device, 1u, &descriptorWrite, 0u, DE_NULL);
	}

	if (m_indexExprType == INDEX_EXPR_TYPE_DYNAMIC_UNIFORM)
	{
		expandedIndices.resize(numInvocations * m_readIndices.size());

		for (int readNdx = 0; readNdx < numReads; readNdx++)
		{
			int* dst = &expandedIndices[numInvocations*readNdx];
			std::fill(dst, dst+numInvocations, m_readIndices[readNdx]);
		}

		for (int readNdx = 0; readNdx < numReads; readNdx++)
			inputs.push_back(&expandedIndices[readNdx*numInvocations]);
	}

	for (int readNdx = 0; readNdx < numReads; readNdx++)
		outputs.push_back(&outValues[readNdx*numInvocations]);

	{
		UniquePtr<ShaderExecutor>	executor	(createExecutor(m_context, m_shaderType, m_shaderSpec, *extraResourcesLayout));

		executor->execute(numInvocations, inputs.empty() ? DE_NULL : &inputs[0], &outputs[0], *extraResourcesSet);
	}

	for (int invocationNdx = 0; invocationNdx < numInvocations; invocationNdx++)
	{
		for (int readNdx = 0; readNdx < numReads; readNdx++)
		{
			const deUint32	refValue	= m_inValues[m_readIndices[readNdx]];
			const deUint32	resValue	= outValues[readNdx*numInvocations + invocationNdx];

			if (refValue != resValue)
			{
				log << tcu::TestLog::Message << "ERROR: at invocation " << invocationNdx
					<< ", read " << readNdx << ": expected "
					<< tcu::toHex(refValue) << ", got " << tcu::toHex(resValue)
					<< tcu::TestLog::EndMessage;

				if (testResult.getCode() == QP_TEST_RESULT_PASS)
					testResult = tcu::TestStatus::fail("Invalid result value");
			}
		}
	}

	return testResult;
}